

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O0

void __thiscall Assimp::ASE::Mesh::~Mesh(Mesh *this)

{
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *local_18;
  Mesh *this_local;
  
  std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::~vector(&this->mBones);
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::~vector
            (&this->mBoneVertices);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector(&this->mVertexColors);
  local_18 = &this->mVertexColors;
  do {
    local_18 = local_18 + -1;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_18);
  } while (local_18 !=
           (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)this->amTexCoords);
  BaseNode::~BaseNode(&this->super_BaseNode);
  MeshWithSmoothingGroups<Assimp::ASE::Face>::~MeshWithSmoothingGroups
            (&this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>);
  return;
}

Assistant:

Mesh() = delete;